

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_ps.c
# Opt level: O2

MPP_RET parse_picture_header_comm(Avs2dCtx_t *p_dec)

{
  BitReadCtx_t *bitctx;
  RK_U8 RVar1;
  byte bVar2;
  MPP_RET MVar3;
  uint uVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  RK_U32 (*paRVar8) [64];
  char *fmt;
  undefined8 uVar9;
  uint uVar10;
  RK_S32 (*alf_coeff) [9];
  ulong uVar11;
  RK_S32 _out;
  RK_U32 *local_50;
  uint local_48;
  uint local_44;
  long local_40;
  RK_U32 (*local_38) [64];
  
  bitctx = &p_dec->bitctx;
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_ps","In","parse_picture_header_comm");
  }
  MVar3 = mpp_read_bits(bitctx,1,&_out);
  (p_dec->bitctx).ret = MVar3;
  if (MVar3 != MPP_OK) goto LAB_00180a9f;
  (p_dec->ph).enable_loop_filter = (byte)_out ^ 1;
  if ((byte)_out != 1) {
    MVar3 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar3;
    if (MVar3 != MPP_OK) goto LAB_00180a9f;
    (p_dec->ph).loop_filter_parameter_flag = (RK_U8)_out;
    if ((RK_U8)_out == '\0') {
      (p_dec->ph).alpha_c_offset = '\0';
      (p_dec->ph).beta_offset = '\0';
      goto LAB_00180af4;
    }
    MVar3 = mpp_read_se(bitctx,&_out);
    (p_dec->bitctx).ret = MVar3;
    if (MVar3 != MPP_OK) goto LAB_00180a9f;
    (p_dec->ph).alpha_c_offset = (RK_U8)_out;
    MVar3 = mpp_read_se(bitctx,&_out);
    (p_dec->bitctx).ret = MVar3;
    if (MVar3 != MPP_OK) goto LAB_00180a9f;
    (p_dec->ph).beta_offset = (char)_out;
    if (0xee < (byte)((char)_out - 9U) && 0xee < (byte)((p_dec->ph).alpha_c_offset - 9U))
    goto LAB_00180af4;
    fmt = "invalid alpha_c_offset/beta_offset.\n";
LAB_00180d71:
    _mpp_log_l(2,"avs2d_ps",fmt,"parse_picture_header_comm");
    MVar3 = MPP_NOK;
    goto LAB_00180f1a;
  }
LAB_00180af4:
  MVar3 = mpp_read_bits(bitctx,1,&_out);
  (p_dec->bitctx).ret = MVar3;
  if (MVar3 != MPP_OK) goto LAB_00180a9f;
  (p_dec->ph).enable_chroma_quant_param = (byte)_out ^ 1;
  if ((byte)_out == 1) {
    (p_dec->ph).chroma_quant_param_delta_cb = '\0';
    (p_dec->ph).chroma_quant_param_delta_cr = '\0';
  }
  else {
    MVar3 = mpp_read_se(bitctx,&_out);
    (p_dec->bitctx).ret = MVar3;
    if (MVar3 != MPP_OK) goto LAB_00180a9f;
    (p_dec->ph).chroma_quant_param_delta_cb = (RK_U8)_out;
    MVar3 = mpp_read_se(bitctx,&_out);
    (p_dec->bitctx).ret = MVar3;
    if (MVar3 != MPP_OK) goto LAB_00180a9f;
    (p_dec->ph).chroma_quant_param_delta_cr = (char)_out;
    if ((byte)((char)_out - 0x11U) < 0xdf ||
        (byte)((p_dec->ph).chroma_quant_param_delta_cb - 0x11U) < 0xdf) {
      fmt = "invalid chrome quant param delta.\n";
      goto LAB_00180d71;
    }
  }
  p_dec->enable_wq = '\0';
  if ((p_dec->vsh).enable_weighted_quant != '\0') {
    MVar3 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar3;
    if (MVar3 != MPP_OK) goto LAB_00180a9f;
    (p_dec->ph).enable_pic_weight_quant = (RK_U8)_out;
    if ((RK_U8)_out != '\0') {
      p_dec->enable_wq = '\x01';
      MVar3 = mpp_read_bits(bitctx,2,&_out);
      (p_dec->bitctx).ret = MVar3;
      if (MVar3 != MPP_OK) goto LAB_00180a9f;
      (p_dec->ph).pic_wq_data_index = (RK_U8)_out;
      if ((_out & 0xffU) == 1) {
        MVar3 = mpp_skip_longbits(bitctx,1);
        (p_dec->bitctx).ret = MVar3;
        if (MVar3 != MPP_OK) {
LAB_00180a9f:
          if (((byte)avs2d_parse_debug & 8) != 0) {
            _mpp_log_l(4,"avs2d_ps","Out, Bit read Err","parse_picture_header_comm");
            MVar3 = (p_dec->bitctx).ret;
          }
          return MVar3;
        }
        MVar3 = mpp_read_bits(bitctx,2,&_out);
        (p_dec->bitctx).ret = MVar3;
        if (MVar3 != MPP_OK) goto LAB_00180a9f;
        (p_dec->ph).wq_param_index = (RK_U8)_out;
        MVar3 = mpp_read_bits(bitctx,2,&_out);
        (p_dec->bitctx).ret = MVar3;
        if (MVar3 != MPP_OK) goto LAB_00180a9f;
        (p_dec->ph).wq_model = (RK_U8)_out;
        RVar1 = (p_dec->ph).wq_param_index;
        if (RVar1 == '\x01') {
          for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
            MVar3 = mpp_read_se(bitctx,&_out);
            (p_dec->bitctx).ret = MVar3;
            if (MVar3 != MPP_OK) goto LAB_00180a9f;
            (p_dec->ph).wq_param_delta1[lVar7] = _out;
          }
        }
        else if (RVar1 == '\x02') {
          for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
            MVar3 = mpp_read_se(bitctx,&_out);
            (p_dec->bitctx).ret = MVar3;
            if (MVar3 != MPP_OK) goto LAB_00180a9f;
            (p_dec->ph).wq_param_delta2[lVar7] = _out;
          }
        }
      }
      else if ((_out & 0xffU) == 2) {
        paRVar8 = (p_dec->ph).pic_wq_matrix;
        lVar7 = 0;
        while (lVar7 != 2) {
          uVar10 = 4 << ((byte)lVar7 & 0x1f);
          local_48 = (uint)lVar7 | 2;
          uVar4 = 0;
          local_40 = lVar7;
          local_38 = paRVar8;
          while (uVar4 != uVar10) {
            local_50 = *local_38 + (uVar4 << ((byte)local_48 & 0x1f));
            local_44 = uVar4;
            for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
              MVar3 = mpp_read_ue(bitctx,(RK_U32 *)&_out);
              (p_dec->bitctx).ret = MVar3;
              if (MVar3 != MPP_OK) goto LAB_00180a9f;
              local_50[uVar11] = _out;
            }
            uVar4 = local_44 + 1;
          }
          paRVar8 = local_38 + 1;
          lVar7 = local_40 + 1;
        }
      }
    }
  }
  if ((p_dec->vsh).enable_alf == '\0') {
    uVar11 = 0;
    goto LAB_00180f4a;
  }
  MVar3 = mpp_read_bits(bitctx,1,&_out);
  (p_dec->bitctx).ret = MVar3;
  if (MVar3 == MPP_OK) {
    (p_dec->ph).enable_pic_alf_y = (RK_U8)_out;
    MVar3 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar3;
    if (MVar3 != MPP_OK) goto LAB_00180ef0;
    (p_dec->ph).enable_pic_alf_cb = (RK_U8)_out;
    MVar3 = mpp_read_bits(bitctx,1,&_out);
    (p_dec->bitctx).ret = MVar3;
    if (MVar3 != MPP_OK) goto LAB_00180ef0;
    (p_dec->ph).enable_pic_alf_cr = (RK_U8)_out;
    if ((p_dec->ph).enable_pic_alf_y == '\0') {
LAB_001810d8:
      if (((p_dec->ph).enable_pic_alf_cb == '\0') ||
         (MVar3 = read_pic_alf_coeff(bitctx,(p_dec->ph).alf_coeff_cb), MPP_NOK < MVar3)) {
        if (((p_dec->ph).enable_pic_alf_cr == '\0') ||
           (MVar3 = read_pic_alf_coeff(bitctx,(p_dec->ph).alf_coeff_cr), MPP_NOK < MVar3)) {
          MVar3 = (p_dec->bitctx).ret;
          goto LAB_00180ef0;
        }
        if (((byte)avs2d_parse_debug & 4) != 0) {
          uVar9 = 0x1e2;
          goto LAB_00181167;
        }
      }
      else if (((byte)avs2d_parse_debug & 4) != 0) {
        uVar9 = 0x1de;
LAB_00181167:
        _mpp_log_l(4,"avs2d_ps","Function error(%d).\n",(char *)0x0,uVar9);
      }
    }
    else {
      MVar3 = mpp_read_ue(bitctx,(RK_U32 *)&_out);
      (p_dec->bitctx).ret = MVar3;
      if (MVar3 != MPP_OK) goto LAB_00180ef0;
      bVar2 = (RK_U8)_out + 1;
      (p_dec->ph).alf_filter_num = bVar2;
      if (bVar2 < 0x11) {
        alf_coeff = (p_dec->ph).alf_coeff_y;
        local_50 = (RK_U32 *)((ulong)local_50 & 0xffffffff00000000);
        for (uVar11 = 0; uVar11 < bVar2; uVar11 = uVar11 + 1) {
          if (uVar11 != 0) {
            iVar6 = 1;
            if (bVar2 != 0x10) {
              MVar3 = mpp_read_ue(bitctx,(RK_U32 *)&_out);
              (p_dec->bitctx).ret = MVar3;
              iVar6 = _out;
              if (MVar3 != MPP_OK) goto LAB_00180ef0;
            }
            (p_dec->ph).alf_filter_pattern[iVar6 + (uint)local_50] = '\x01';
            local_50 = (RK_U32 *)CONCAT44(local_50._4_4_,iVar6 + (uint)local_50);
          }
          MVar3 = read_pic_alf_coeff(bitctx,*alf_coeff);
          if (MVar3 < MPP_OK) {
            if (((byte)avs2d_parse_debug & 4) == 0) goto LAB_00180ef4;
            uVar9 = 0x1cc;
            goto LAB_00181167;
          }
          bVar2 = (p_dec->ph).alf_filter_num;
          alf_coeff = alf_coeff + 1;
        }
        if ((uint)local_50 < 0x10) {
          (p_dec->ph).alf_coeff_idx_tab[0] = '\0';
          cVar5 = '\0';
          for (lVar7 = -0xf; lVar7 != 0; lVar7 = lVar7 + 1) {
            cVar5 = (cVar5 + '\x01') - ((p_dec->ph).alf_coeff_idx_tab[lVar7] == '\0');
            *(char *)((long)(p_dec->ph).alf_coeff_y[0] + lVar7) = cVar5;
          }
          goto LAB_001810d8;
        }
        _mpp_log_l(2,"avs2d_ps","invalid alf region distance.\n","parse_pic_alf_params");
      }
      else {
        _mpp_log_l(2,"avs2d_ps","invalid alf filter num(%d).\n","parse_pic_alf_params",(ulong)bVar2)
        ;
      }
      MVar3 = MPP_NOK;
    }
  }
  else {
LAB_00180ef0:
    uVar11 = (ulong)(uint)MVar3;
    if (MPP_NOK < MVar3) {
LAB_00180f4a:
      if (((byte)avs2d_parse_debug & 8) == 0) {
        return (MPP_RET)uVar11;
      }
      _mpp_log_l(4,"avs2d_ps","Out, ret %d\n","parse_picture_header_comm",uVar11);
      return (MPP_RET)uVar11;
    }
  }
LAB_00180ef4:
  if (((byte)avs2d_parse_debug & 4) != 0) {
    _mpp_log_l(4,"avs2d_ps","Function error(%d).\n",(char *)0x0,0x23c);
  }
LAB_00180f1a:
  if (((byte)avs2d_parse_debug & 8) == 0) {
    return MVar3;
  }
  _mpp_log_l(4,"avs2d_ps","Out, Failed","parse_picture_header_comm");
  return MVar3;
}

Assistant:

static MPP_RET parse_picture_header_comm(Avs2dCtx_t *p_dec)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i, j;
    RK_U32 val_temp = 0;

    BitReadCtx_t *bitctx  = &p_dec->bitctx;
    Avs2dSeqHeader_t *vsh = &p_dec->vsh;
    Avs2dPicHeader_t *ph  = &p_dec->ph;

    AVS2D_PARSE_TRACE("In");
    READ_ONEBIT(bitctx, &val_temp);
    ph->enable_loop_filter = val_temp ^ 0x01;
    if (ph->enable_loop_filter) {
        READ_ONEBIT(bitctx, &ph->loop_filter_parameter_flag);
        if (ph->loop_filter_parameter_flag) {
            READ_SE(bitctx, &ph->alpha_c_offset);
            READ_SE(bitctx, &ph->beta_offset);
            if (ph->alpha_c_offset < -8 || ph->alpha_c_offset > 8 ||
                ph->beta_offset < -8 || ph->beta_offset > 8) {
                ret = MPP_NOK;
                mpp_err_f("invalid alpha_c_offset/beta_offset.\n");
                goto __FAILED;
            }
        } else {
            ph->alpha_c_offset = 0;
            ph->beta_offset    = 0;
        }
    }

    READ_ONEBIT(bitctx, &val_temp);
    ph->enable_chroma_quant_param = val_temp ^ 0x01;
    if (ph->enable_chroma_quant_param) {
        READ_SE(bitctx, &ph->chroma_quant_param_delta_cb);
        READ_SE(bitctx, &ph->chroma_quant_param_delta_cr);
    } else {
        ph->chroma_quant_param_delta_cb = 0;
        ph->chroma_quant_param_delta_cr = 0;
    }
    if (ph->chroma_quant_param_delta_cb < -16 || ph->chroma_quant_param_delta_cb > 16 ||
        ph->chroma_quant_param_delta_cr < -16 || ph->chroma_quant_param_delta_cr > 16) {
        ret = MPP_NOK;
        mpp_err_f("invalid chrome quant param delta.\n");
        goto __FAILED;
    }

    p_dec->enable_wq = 0;
    if (vsh->enable_weighted_quant) {
        READ_ONEBIT(bitctx, &ph->enable_pic_weight_quant);
        if (ph->enable_pic_weight_quant) {
            p_dec->enable_wq = 1;
            READ_BITS(bitctx, 2, &ph->pic_wq_data_index);
            if (ph->pic_wq_data_index == 1) {
                SKIP_BITS(bitctx, 1);
                READ_BITS(bitctx, 2, &ph->wq_param_index);
                READ_BITS(bitctx, 2, &ph->wq_model);
                if (ph->wq_param_index == 1) {
                    for (i = 0; i < 6; i++) {
                        READ_SE(bitctx, &ph->wq_param_delta1[i]);
                    }
                } else if (ph->wq_param_index == 2) {
                    for (i = 0; i < 6; i++) {
                        READ_SE(bitctx, &ph->wq_param_delta2[i]);
                    }
                }
            } else if (ph->pic_wq_data_index == 2) {
                RK_U32 size_id, wqm_size;
                for (size_id = 0; size_id < 2; size_id++) {
                    wqm_size = MPP_MIN(1 << (size_id + 2), 8);
                    for (j = 0; j < wqm_size; j++) {
                        for (i = 0; i < wqm_size; i++) {
                            READ_UE(bitctx, &ph->pic_wq_matrix[size_id][j * wqm_size + i]);
                        }
                    }
                }
            }

        }
    }

    if (vsh->enable_alf) {
        FUN_CHECK(ret = parse_pic_alf_params(bitctx, ph));
    }

    AVS2D_PARSE_TRACE("Out, ret %d\n", ret);
    return ret;
__BITREAD_ERR:
    AVS2D_PARSE_TRACE("Out, Bit read Err");
    return ret = bitctx->ret;
__FAILED:
    AVS2D_PARSE_TRACE("Out, Failed");
    return ret;
}